

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_resize.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListResizeBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  element_type *peVar3;
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  pointer pEVar9;
  undefined8 *puVar10;
  LogicalType *pLVar11;
  pointer *__ptr;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 local_68 [8];
  undefined8 local_60;
  _Alloc_hider _Stack_58;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  LogicalType::LogicalType((LogicalType *)local_68,UBIGINT);
  this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_00,1);
  _Var5._M_p = _Stack_58._M_p;
  peVar3 = local_60;
  pvVar7->id_ = local_68[0];
  pvVar7->physical_type_ = local_68[1];
  uVar12 = *(undefined4 *)
            &(pvVar7->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar13 = *(undefined4 *)
            ((long)&(pvVar7->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  uVar14 = *(undefined4 *)
            &(pvVar7->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar15 = *(undefined4 *)
            ((long)&(pvVar7->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (pvVar7->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (pvVar7->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = (element_type *)0x0;
  _Stack_58._M_p = (pointer)0x0;
  p_Var1 = (pvVar7->type_info_).internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pvVar7->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (pvVar7->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48._M_allocated_capacity._0_4_ = uVar12;
    local_48._M_allocated_capacity._4_4_ = uVar13;
    local_48._8_4_ = uVar14;
    local_48._12_4_ = uVar15;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    uVar12 = local_48._M_allocated_capacity._0_4_;
    uVar13 = local_48._M_allocated_capacity._4_4_;
    uVar14 = local_48._8_4_;
    uVar15 = local_48._12_4_;
  }
  _Var5._M_p = _Stack_58._M_p;
  local_60 = (element_type *)CONCAT44(uVar13,uVar12);
  _Stack_58._M_p._4_4_ = uVar15;
  _Stack_58._M_p._0_4_ = uVar14;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)local_68);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_50._M_head_impl =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_68,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_50);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  auVar4 = local_68;
  local_68 = (undefined1  [8])0x0;
  _Var2._M_head_impl =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar4;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_68 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_68 + 8))();
  }
  local_68 = (undefined1  [8])0x0;
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_50._M_head_impl = (Expression *)0x0;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar8);
  LogicalType::LogicalType((LogicalType *)local_68,SQLNULL);
  bVar6 = LogicalType::operator==(&pEVar9->return_type,(LogicalType *)local_68);
  LogicalType::~LogicalType((LogicalType *)local_68);
  if (bVar6) {
    LogicalType::LogicalType((LogicalType *)local_68,SQLNULL);
    pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
    _Var5._M_p = _Stack_58._M_p;
    peVar3 = local_60;
    pvVar7->id_ = local_68[0];
    pvVar7->physical_type_ = local_68[1];
    uVar12 = *(undefined4 *)
              &(pvVar7->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar13 = *(undefined4 *)
              ((long)&(pvVar7->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar14 = *(undefined4 *)
              &(pvVar7->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar15 = *(undefined4 *)
              ((long)&(pvVar7->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar7->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar7->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60 = (element_type *)0x0;
    _Stack_58._M_p = (pointer)0x0;
    p_Var1 = (pvVar7->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pvVar7->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (pvVar7->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_48._M_allocated_capacity._0_4_ = uVar12;
      local_48._M_allocated_capacity._4_4_ = uVar13;
      local_48._8_4_ = uVar14;
      local_48._12_4_ = uVar15;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar12 = local_48._M_allocated_capacity._0_4_;
      uVar13 = local_48._M_allocated_capacity._4_4_;
      uVar14 = local_48._8_4_;
      uVar15 = local_48._12_4_;
    }
    _Var5._M_p = _Stack_58._M_p;
    local_60 = (element_type *)CONCAT44(uVar13,uVar12);
    _Stack_58._M_p._4_4_ = uVar15;
    _Stack_58._M_p._0_4_ = uVar14;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p);
    }
    LogicalType::~LogicalType((LogicalType *)local_68);
    LogicalType::LogicalType((LogicalType *)local_68,SQLNULL);
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_68[0];
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_68[1];
    peVar3 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
    (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_58._M_p;
    local_60 = peVar3;
    _Stack_58._M_p = (pointer)p_Var1;
    LogicalType::~LogicalType((LogicalType *)local_68);
    puVar10 = (undefined8 *)operator_new(0x20);
    LogicalType::LogicalType
              ((LogicalType *)local_68,&(bound_function->super_BaseScalarFunction).return_type);
  }
  else {
    pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar8);
    LogicalType::LogicalType((LogicalType *)local_68,UNKNOWN);
    bVar6 = LogicalType::operator==(&pEVar9->return_type,(LogicalType *)local_68);
    LogicalType::~LogicalType((LogicalType *)local_68);
    if (bVar6) {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      pLVar11 = &(bound_function->super_BaseScalarFunction).return_type;
      if (pLVar11 != &pEVar9->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar9->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar9->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar9->return_type).type_info_);
      }
      puVar10 = (undefined8 *)operator_new(0x20);
      LogicalType::LogicalType((LogicalType *)local_68,pLVar11);
    }
    else {
      if ((long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x48) {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        pLVar11 = ListType::GetChildType(&pEVar9->return_type);
        pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,2);
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar8);
        bVar6 = LogicalType::operator==(pLVar11,&pEVar9->return_type);
        if (!bVar6) {
          pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[](arguments,2);
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(pvVar8);
          LogicalType::LogicalType((LogicalType *)local_68,SQLNULL);
          bVar6 = LogicalType::operator==(&pEVar9->return_type,(LogicalType *)local_68);
          LogicalType::~LogicalType((LogicalType *)local_68);
          if (!bVar6) {
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[](arguments,0);
            pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(pvVar8);
            pLVar11 = ListType::GetChildType(&pEVar9->return_type);
            pvVar7 = vector<duckdb::LogicalType,_true>::operator[](this_00,2);
            if (pvVar7 != pLVar11) {
              pvVar7->id_ = pLVar11->id_;
              pvVar7->physical_type_ = pLVar11->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&pvVar7->type_info_,&pLVar11->type_info_);
            }
          }
        }
      }
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      pLVar11 = &(bound_function->super_BaseScalarFunction).return_type;
      if (pLVar11 != &pEVar9->return_type) {
        (bound_function->super_BaseScalarFunction).return_type.id_ = (pEVar9->return_type).id_;
        (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar9->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar9->return_type).type_info_);
      }
      puVar10 = (undefined8 *)operator_new(0x20);
      LogicalType::LogicalType((LogicalType *)local_68,pLVar11);
    }
  }
  *puVar10 = &PTR__VariableReturnBindData_02451f48;
  LogicalType::LogicalType((LogicalType *)(puVar10 + 1),(LogicalType *)local_68);
  LogicalType::~LogicalType((LogicalType *)local_68);
  *(undefined8 **)this = puVar10;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListResizeBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2 || arguments.size() == 3);
	bound_function.arguments[1] = LogicalType::UBIGINT;

	// If the first argument is an array, cast it to a list.
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	// Early-out, if the first argument is a constant NULL.
	if (arguments[0]->return_type == LogicalType::SQLNULL) {
		bound_function.arguments[0] = LogicalType::SQLNULL;
		bound_function.return_type = LogicalType::SQLNULL;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// Early-out, if the first argument is a prepared statement.
	if (arguments[0]->return_type == LogicalType::UNKNOWN) {
		bound_function.return_type = arguments[0]->return_type;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// Attempt implicit casting, if the default type does not match list the list child type.
	if (bound_function.arguments.size() == 3 &&
	    ListType::GetChildType(arguments[0]->return_type) != arguments[2]->return_type &&
	    arguments[2]->return_type != LogicalTypeId::SQLNULL) {
		bound_function.arguments[2] = ListType::GetChildType(arguments[0]->return_type);
	}

	bound_function.return_type = arguments[0]->return_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}